

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfZip.cpp
# Opt level: O0

void Imf_3_4::anon_unknown_0::interleave_sse2(char *source,size_t outSize,char *out)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 *in_RDX;
  ulong in_RSI;
  undefined8 *in_RDI;
  __m128i *v2;
  __m128i *v1;
  size_t vOutSize;
  undefined1 local_129;
  ulong local_128;
  undefined8 *local_120;
  undefined8 *local_118;
  undefined8 *local_110;
  ulong local_c8;
  undefined8 *local_c0;
  undefined8 *local_b8;
  undefined8 *local_b0;
  undefined1 uStack_78;
  undefined1 uStack_77;
  undefined1 uStack_76;
  undefined1 uStack_75;
  undefined1 uStack_74;
  undefined1 uStack_73;
  undefined1 uStack_72;
  undefined1 uStack_71;
  size_t i_1;
  char *sOut;
  char *t2;
  char *t1;
  __m128i hi;
  __m128i lo;
  __m128i b;
  __m128i a;
  size_t i;
  __m128i *vOut;
  
  local_c0 = in_RDX;
  local_b8 = (undefined8 *)((long)in_RDI + (in_RSI + 1 >> 1));
  local_b0 = in_RDI;
  for (local_c8 = 0; local_c8 < in_RSI >> 5; local_c8 = local_c8 + 1) {
    uVar1 = *local_b0;
    uVar2 = local_b0[1];
    uVar3 = *local_b8;
    uVar4 = local_b8[1];
    sOut._0_1_ = (undefined1)uVar1;
    sOut._1_1_ = (undefined1)((ulong)uVar1 >> 8);
    sOut._2_1_ = (undefined1)((ulong)uVar1 >> 0x10);
    sOut._3_1_ = (undefined1)((ulong)uVar1 >> 0x18);
    sOut._4_1_ = (undefined1)((ulong)uVar1 >> 0x20);
    sOut._5_1_ = (undefined1)((ulong)uVar1 >> 0x28);
    sOut._6_1_ = (undefined1)((ulong)uVar1 >> 0x30);
    sOut._7_1_ = (undefined1)((ulong)uVar1 >> 0x38);
    uStack_78 = (undefined1)uVar3;
    uStack_77 = (undefined1)((ulong)uVar3 >> 8);
    uStack_76 = (undefined1)((ulong)uVar3 >> 0x10);
    uStack_75 = (undefined1)((ulong)uVar3 >> 0x18);
    uStack_74 = (undefined1)((ulong)uVar3 >> 0x20);
    uStack_73 = (undefined1)((ulong)uVar3 >> 0x28);
    uStack_72 = (undefined1)((ulong)uVar3 >> 0x30);
    uStack_71 = (undefined1)((ulong)uVar3 >> 0x38);
    lo[0]._0_1_ = (undefined1)uVar2;
    lo[0]._1_1_ = (undefined1)((ulong)uVar2 >> 8);
    lo[0]._2_1_ = (undefined1)((ulong)uVar2 >> 0x10);
    lo[0]._3_1_ = (undefined1)((ulong)uVar2 >> 0x18);
    lo[0]._4_1_ = (undefined1)((ulong)uVar2 >> 0x20);
    lo[0]._5_1_ = (undefined1)((ulong)uVar2 >> 0x28);
    lo[0]._6_1_ = (undefined1)((ulong)uVar2 >> 0x30);
    lo[0]._7_1_ = (undefined1)((ulong)uVar2 >> 0x38);
    hi[0]._0_1_ = (undefined1)uVar4;
    hi[0]._1_1_ = (undefined1)((ulong)uVar4 >> 8);
    hi[0]._2_1_ = (undefined1)((ulong)uVar4 >> 0x10);
    hi[0]._3_1_ = (undefined1)((ulong)uVar4 >> 0x18);
    hi[0]._4_1_ = (undefined1)((ulong)uVar4 >> 0x20);
    hi[0]._5_1_ = (undefined1)((ulong)uVar4 >> 0x28);
    hi[0]._6_1_ = (undefined1)((ulong)uVar4 >> 0x30);
    hi[0]._7_1_ = (undefined1)((ulong)uVar4 >> 0x38);
    *local_c0 = CONCAT17(uStack_75,
                         CONCAT16(sOut._3_1_,
                                  CONCAT15(uStack_76,
                                           CONCAT14(sOut._2_1_,
                                                    CONCAT13(uStack_77,
                                                             CONCAT12(sOut._1_1_,
                                                                      CONCAT11(uStack_78,sOut._0_1_)
                                                                     ))))));
    local_c0[1] = CONCAT17(uStack_71,
                           CONCAT16(sOut._7_1_,
                                    CONCAT15(uStack_72,
                                             CONCAT14(sOut._6_1_,
                                                      CONCAT13(uStack_73,
                                                               CONCAT12(sOut._5_1_,
                                                                        CONCAT11(uStack_74,
                                                                                 sOut._4_1_)))))));
    local_c0[2] = CONCAT17(hi[0]._3_1_,
                           CONCAT16(lo[0]._3_1_,
                                    CONCAT15(hi[0]._2_1_,
                                             CONCAT14(lo[0]._2_1_,
                                                      CONCAT13(hi[0]._1_1_,
                                                               CONCAT12(lo[0]._1_1_,
                                                                        CONCAT11((undefined1)hi[0],
                                                                                 (undefined1)lo[0]))
                                                              )))));
    local_c0[3] = CONCAT17(hi[0]._7_1_,
                           CONCAT16(lo[0]._7_1_,
                                    CONCAT15(hi[0]._6_1_,
                                             CONCAT14(lo[0]._6_1_,
                                                      CONCAT13(hi[0]._5_1_,
                                                               CONCAT12(lo[0]._5_1_,
                                                                        CONCAT11(hi[0]._4_1_,
                                                                                 lo[0]._4_1_)))))));
    local_c0 = local_c0 + 4;
    local_b8 = local_b8 + 2;
    local_b0 = local_b0 + 2;
  }
  local_110 = local_b0;
  local_118 = local_b8;
  local_120 = local_c0;
  for (local_128 = (in_RSI >> 5) << 5; local_128 < in_RSI; local_128 = local_128 + 1) {
    if ((local_128 & 1) == 0) {
      local_129 = *(undefined1 *)local_110;
      local_110 = (undefined8 *)((long)local_110 + 1);
    }
    else {
      local_129 = *(undefined1 *)local_118;
      local_118 = (undefined8 *)((long)local_118 + 1);
    }
    *(undefined1 *)local_120 = local_129;
    local_120 = (undefined8 *)((long)local_120 + 1);
  }
  return;
}

Assistant:

void
interleave_sse2 (const char* source, size_t outSize, char* out)
{
    static const size_t bytesPerChunk = 2 * sizeof (__m128i);

    const size_t vOutSize = outSize / bytesPerChunk;

    const __m128i* v1 = reinterpret_cast<const __m128i*> (source);
    const __m128i* v2 =
        reinterpret_cast<const __m128i*> (source + (outSize + 1) / 2);
    __m128i* vOut = reinterpret_cast<__m128i*> (out);

    for (size_t i = 0; i < vOutSize; ++i)
    {
        __m128i a = _mm_loadu_si128 (v1++);
        __m128i b = _mm_loadu_si128 (v2++);

        __m128i lo = _mm_unpacklo_epi8 (a, b);
        __m128i hi = _mm_unpackhi_epi8 (a, b);

        _mm_storeu_si128 (vOut++, lo);
        _mm_storeu_si128 (vOut++, hi);
    }

    const char* t1   = reinterpret_cast<const char*> (v1);
    const char* t2   = reinterpret_cast<const char*> (v2);
    char*       sOut = reinterpret_cast<char*> (vOut);

    for (size_t i = vOutSize * bytesPerChunk; i < outSize; ++i)
    {
        *(sOut++) = (i % 2 == 0) ? *(t1++) : *(t2++);
    }
}